

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

curl_mimepart * curl_mime_addpart(curl_mime *mime)

{
  Curl_easy *pCVar1;
  curl_mimepart *pcVar2;
  curl_mimepart *pcVar3;
  
  if ((mime != (curl_mime *)0x0) &&
     (pcVar2 = (curl_mimepart *)(*Curl_cmalloc)(0x1c0), pcVar2 != (curl_mimepart *)0x0)) {
    pCVar1 = mime->easy;
    memset(&pcVar2->nextpart,0,0x1a8);
    pcVar2->easy = pCVar1;
    pcVar2->lastreadstatus = 1;
    (pcVar2->state).ptr = (void *)0x0;
    (pcVar2->state).offset = 0;
    pcVar2->parent = mime;
    pcVar3 = mime->lastpart;
    if (mime->lastpart == (curl_mimepart *)0x0) {
      pcVar3 = (curl_mimepart *)mime;
    }
    pcVar3->nextpart = pcVar2;
    mime->lastpart = pcVar2;
    return pcVar2;
  }
  return (curl_mimepart *)0x0;
}

Assistant:

curl_mimepart *curl_mime_addpart(curl_mime *mime)
{
  curl_mimepart *part;

  if(!mime)
    return NULL;

  part = (curl_mimepart *) malloc(sizeof(*part));

  if(part) {
    Curl_mime_initpart(part, mime->easy);
    part->parent = mime;

    if(mime->lastpart)
      mime->lastpart->nextpart = part;
    else
      mime->firstpart = part;

    mime->lastpart = part;
  }

  return part;
}